

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int get_mvpred_compound_sad
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,buf_2d *src,uint8_t *ref_address,
              int ref_stride)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int invert_mask;
  int mask_stride;
  uint8_t *second_pred;
  uint8_t *mask;
  int src_stride;
  uint8_t *src_buf;
  aom_variance_fn_ptr_t *vfp;
  int local_4;
  
  uVar2 = *in_RSI;
  uVar1 = *(undefined4 *)(in_RSI + 3);
  lVar3 = *(long *)(in_RDI + 0x20);
  if (*(long *)(in_RDI + 0x28) == 0) {
    if (lVar3 == 0) {
      local_4 = (**(code **)(in_RDI + 200))(uVar2,uVar1,in_RDX,in_ECX);
    }
    else {
      local_4 = (**(code **)(*(long *)(in_RDI + 8) + 0x10))(uVar2,uVar1,in_RDX,in_ECX,lVar3);
    }
  }
  else {
    local_4 = (**(code **)(*(long *)(in_RDI + 8) + 0x48))
                        (uVar2,uVar1,in_RDX,in_ECX,lVar3,*(long *)(in_RDI + 0x28),
                         *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0x34));
  }
  return local_4;
}

Assistant:

static inline int get_mvpred_compound_sad(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const struct buf_2d *const src, const uint8_t *const ref_address,
    const int ref_stride) {
  const aom_variance_fn_ptr_t *vfp = ms_params->vfp;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;

  const uint8_t *mask = ms_params->ms_buffers.mask;
  const uint8_t *second_pred = ms_params->ms_buffers.second_pred;
  const int mask_stride = ms_params->ms_buffers.mask_stride;
  const int invert_mask = ms_params->ms_buffers.inv_mask;

  if (mask) {
    return vfp->msdf(src_buf, src_stride, ref_address, ref_stride, second_pred,
                     mask, mask_stride, invert_mask);
  } else if (second_pred) {
    assert(vfp->sdaf != NULL);
    return vfp->sdaf(src_buf, src_stride, ref_address, ref_stride, second_pred);
  } else {
    return ms_params->sdf(src_buf, src_stride, ref_address, ref_stride);
  }
}